

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::check_sign<char>(char **s,Arg *arg)

{
  FormatError *this;
  CStringRef local_50;
  string local_48;
  CStringRef local_28;
  char local_19;
  Arg *pAStack_18;
  char sign;
  Arg *arg_local;
  char **s_local;
  
  local_19 = **s;
  pAStack_18 = arg;
  arg_local = (Arg *)s;
  require_numeric_argument(arg,local_19);
  if ((pAStack_18->type != UINT) && (pAStack_18->type != ULONG_LONG)) {
    (arg_local->super_Value).field_0.pointer =
         (void *)((arg_local->super_Value).field_0.long_long_value + 1);
    return;
  }
  this = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef
            (&local_50,"format specifier \'{}\' requires signed argument");
  format<char>(&local_48,local_50,&local_19);
  BasicCStringRef<char>::BasicCStringRef<std::allocator<char>>(&local_28,&local_48);
  FormatError::FormatError(this,local_28);
  __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void check_sign(const Char *&s, const Arg &arg) {
  char sign = static_cast<char>(*s);
  require_numeric_argument(arg, sign);
  if (arg.type == Arg::UINT || arg.type == Arg::ULONG_LONG) {
    FMT_THROW(FormatError(fmt::format(
      "format specifier '{}' requires signed argument", sign)));
  }
  ++s;
}